

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

bool __thiscall ON_HistoryRecord::SetStringValue(ON_HistoryRecord *this,int value_id,wchar_t *s)

{
  ON_Value *pOVar1;
  ON_wString *this_00;
  ON_StringValue *v;
  wchar_t *s_local;
  int value_id_local;
  ON_HistoryRecord *this_local;
  
  pOVar1 = FindValueHelper(this,value_id,8,true);
  if (pOVar1 != (ON_Value *)0x0) {
    ON_ClassArray<ON_wString>::Destroy((ON_ClassArray<ON_wString> *)(pOVar1 + 1));
    this_00 = ON_ClassArray<ON_wString>::AppendNew((ON_ClassArray<ON_wString> *)(pOVar1 + 1));
    ON_wString::operator=(this_00,s);
  }
  return pOVar1 != (ON_Value *)0x0;
}

Assistant:

bool ON_HistoryRecord::SetStringValue( int value_id, const wchar_t* s )
{
  ON_StringValue* v = static_cast<ON_StringValue*>(FindValueHelper(value_id,ON_Value::string_value,true));
  if ( v )
  {
    v->m_value.Destroy();
    v->m_value.AppendNew() = s;
  }
  return (0 != v);
}